

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

void __thiscall
testing::internal::FunctionMocker<void_(int,_int)>::PerformAction
          (FunctionMocker<void_(int,_int)> *this,void *untyped_action,ArgumentTuple *args,
          string *call_description)

{
  Action<void_(int,_int)> action;
  _Any_data _Stack_38;
  code *local_28;
  ArgumentTuple local_18;
  
  if (untyped_action != (void *)0x0) {
    std::function<void_(int,_int)>::function
              ((function<void_(int,_int)> *)&_Stack_38,(function<void_(int,_int)> *)untyped_action);
    local_18.super__Tuple_impl<0UL,_int,_int>.super__Tuple_impl<1UL,_int>.
    super__Head_base<1UL,_int,_false>._M_head_impl =
         (_Head_base<1UL,_int,_false>)
         (args->super__Tuple_impl<0UL,_int,_int>).super__Tuple_impl<1UL,_int>.
         super__Head_base<1UL,_int,_false>._M_head_impl;
    local_18.super__Tuple_impl<0UL,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl =
         (args->super__Tuple_impl<0UL,_int,_int>).super__Head_base<0UL,_int,_false>._M_head_impl;
    Action<void_(int,_int)>::Perform((Action<void_(int,_int)> *)&_Stack_38,&local_18);
    if (local_28 != (code *)0x0) {
      (*local_28)(&_Stack_38,&_Stack_38,__destroy_functor);
    }
    return;
  }
  PerformDefaultAction(this,args,call_description);
  return;
}

Assistant:

R PerformAction(const void* untyped_action, ArgumentTuple&& args,
                  const std::string& call_description) const {
    if (untyped_action == nullptr) {
      return PerformDefaultAction(std::move(args), call_description);
    }

    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    return action.Perform(std::move(args));
  }